

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::hugeint_t,long,duckdb::ArgMinMaxState<duckdb::hugeint_t,long>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<duckdb::hugeint_t,_long> *state,hugeint_t x_data,long y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)(y_data + 0x10),
                     *(idx_t *)(y_data + 0x20));
  if ((bVar1) && (x_data.upper < *(long *)(this + 0x18))) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (*(TemplatedValidityMask<unsigned_long> **)(y_data + 8),
                       *(idx_t *)(y_data + 0x18));
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)!bVar1;
    if (bVar1) {
      *(ArgMinMaxState<duckdb::hugeint_t,_long> **)(this + 8) = state;
      *(uint64_t *)(this + 0x10) = x_data.lower;
    }
    *(int64_t *)(this + 0x18) = x_data.upper;
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}